

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O2

auto_ptr<avro::OutputStream> __thiscall
avro::parsing::generate
          (parsing *this,Encoder *e,char *calls,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  string *s;
  string *s_00;
  string *s_01;
  char *pcVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer s_02;
  long lStackY_100;
  char c;
  Scanner sc;
  undefined1 local_d0 [8];
  bool local_c8;
  undefined7 uStack_c7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  OutputStream *local_b0;
  undefined **local_a8;
  undefined **local_a0;
  undefined1 local_98 [24];
  const_string local_80;
  const_string local_70;
  const_string local_60;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  char *local_38;
  
  sc.p = calls;
  sVar4 = strlen(calls);
  s_02 = (values->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  sc.end = calls + sVar4;
  avro::memoryOutputStream((ulong)this);
  __return_storage_ptr__ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e;
  local_b0 = (OutputStream *)this;
  (**(code **)(*(long *)e + 0x10))(e,*(undefined8 *)this);
  local_a0 = &PTR__lazy_ostream_001ecc60;
  local_a8 = &PTR__lazy_ostream_001ecc20;
  pcVar5 = calls + sVar4;
LAB_00189840:
  if (calls == pcVar5) {
    (**(code **)(*(long *)e + 0x18))(e);
    return (auto_ptr<avro::OutputStream>)local_b0;
  }
  sc.p = calls + 1;
  c = *calls;
  lVar6 = 0x68;
  lStackY_100 = 0x20;
  switch(c) {
  case 'B':
    bVar2 = from_string<bool>(s_02);
    __return_storage_ptr__ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e;
    (**(code **)(*(long *)e + 0x28))(e,bVar2);
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'M':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'T':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case '\\':
  case '^':
  case '_':
  case '`':
  case 'a':
  case 'd':
switchD_0018986f_caseD_43:
    local_60.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
    ;
    local_60.m_end = "";
    local_70.m_begin = "";
    local_70.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__return_storage_ptr__,&local_60,0x12d,&local_70);
    local_98[0] = (class_property<bool>)0x0;
    local_98._8_8_ = (element_type *)0x0;
    local_98._16_8_ = (sp_counted_base *)0x0;
    local_48 = 0;
    local_50 = local_a0;
    local_40 = &boost::unit_test::lazy_ostream::inst;
    local_38 = "Unknown mnemonic: ";
    local_c8 = false;
    local_d0 = (undefined1  [8])local_a8;
    local_c0._M_allocated_capacity = (size_type)&local_50;
    local_c0._8_8_ = &c;
    local_80.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
    ;
    local_80.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,(lazy_ostream *)local_d0,&local_80,0x12d,REQUIRE,
               CHECK_MSG,0);
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10);
    boost::detail::shared_count::~shared_count((shared_count *)__return_storage_ptr__);
    pcVar5 = sc.end;
    calls = sc.p;
    goto LAB_00189840;
  case 'D':
    dVar1 = from_string<double>(s_02);
    __return_storage_ptr__ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e;
    (**(code **)(*(long *)e + 0x48))(SUB84(dVar1,0));
    break;
  case 'F':
    from_string<float>(s_02);
    __return_storage_ptr__ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e;
    (**(code **)(*(long *)e + 0x40))();
    break;
  case 'I':
    iVar3 = from_string<int>(s_02);
    __return_storage_ptr__ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e;
    (**(code **)(*(long *)e + 0x30))(e,iVar3);
    break;
  case 'K':
  case 'S':
    Scanner::extractInt(&sc);
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
    from_string<std::__cxx11::string>(__return_storage_ptr__,(parsing *)s_02,s);
    (**(code **)(*(long *)e + 0x50))(e,__return_storage_ptr__);
    s_02 = s_02 + 1;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    pcVar5 = sc.end;
    calls = sc.p;
    goto LAB_00189840;
  case 'L':
    lVar6 = from_string<long>(s_02);
    __return_storage_ptr__ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e;
    (**(code **)(*(long *)e + 0x38))(e,lVar6);
    break;
  case 'N':
    goto switchD_0018986f_caseD_4e;
  case 'U':
    lVar6 = 0xa0;
  case 'e':
switchD_0018986f_caseD_65:
    iVar3 = Scanner::extractInt(&sc);
    __return_storage_ptr__ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e;
    (**(code **)(*(long *)e + lVar6))(e,(long)iVar3);
    pcVar5 = sc.end;
    calls = sc.p;
    goto LAB_00189840;
  case '[':
    lStackY_100 = 0x70;
    goto switchD_0018986f_caseD_4e;
  case ']':
    lStackY_100 = 0x78;
    goto switchD_0018986f_caseD_4e;
  case 'b':
    Scanner::extractInt(&sc);
    from_string<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,(parsing *)s_02,
               s_00);
    Encoder::encodeBytes(e,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    goto LAB_00189a3a;
  case 'c':
    lVar6 = 0x90;
    goto switchD_0018986f_caseD_65;
  case 'f':
    Scanner::extractInt(&sc);
    from_string<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,(parsing *)s_02,
               s_01);
    (**(code **)(*(long *)e + 0x60))(e,local_d0,CONCAT71(uStack_c7,local_c8) - (long)local_d0);
LAB_00189a3a:
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
    s_02 = s_02 + 1;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__
              );
    pcVar5 = sc.end;
    calls = sc.p;
    goto LAB_00189840;
  default:
    if (c == 's') {
      lStackY_100 = 0x98;
    }
    else if (c == '{') {
      lStackY_100 = 0x80;
    }
    else {
      if (c != '}') goto switchD_0018986f_caseD_43;
      lStackY_100 = 0x88;
    }
switchD_0018986f_caseD_4e:
    __return_storage_ptr__ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e;
    (**(code **)(*(long *)e + lStackY_100))();
    pcVar5 = sc.end;
    calls = sc.p;
    goto LAB_00189840;
  }
  s_02 = s_02 + 1;
  pcVar5 = sc.end;
  calls = sc.p;
  goto LAB_00189840;
}

Assistant:

static auto_ptr<OutputStream> generate(Encoder& e, const char* calls,
    const vector<string>& values)
{
    Scanner sc(calls);
    vector<string>::const_iterator it = values.begin();
    auto_ptr<OutputStream> ob = memoryOutputStream();
    e.init(*ob);

    while (! sc.isDone()) {
        char c = sc.advance();

        switch (c) {
        case 'N':
            e.encodeNull();
            break;
        case 'B':
            e.encodeBool(from_string<bool>(*it++));
            break;
        case 'I':
            e.encodeInt(from_string<int32_t>(*it++));
            break;
        case 'L':
            e.encodeLong(from_string<int64_t>(*it++));
            break;
        case 'F':
            e.encodeFloat(from_string<float>(*it++));
            break;
        case 'D':
            e.encodeDouble(from_string<double>(*it++));
            break;
        case 'S':
        case 'K':
            sc.extractInt();
            e.encodeString(from_string<string>(*it++));
            break;
        case 'b':
            sc.extractInt();
            e.encodeBytes(from_string<vector<uint8_t> >(*it++));
            break;
        case 'f':
            sc.extractInt();
            e.encodeFixed(from_string<vector<uint8_t> >(*it++));
            break;
        case 'e':
            e.encodeEnum(sc.extractInt());
            break;
        case '[':
            e.arrayStart();
            break;
        case ']':
            e.arrayEnd();
            break;
        case '{':
            e.mapStart();
            break;
        case '}':
            e.mapEnd();
            break;
        case 'c':
            e.setItemCount(sc.extractInt());
            break;
        case 's':
            e.startItem();
            break;
        case 'U':
            e.encodeUnionIndex(sc.extractInt());
            break;
        default:
            BOOST_FAIL("Unknown mnemonic: " << c);
        }
    }
    e.flush();
    return ob;
}